

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::Pipeline::Pipeline(Pipeline *this,Pipeline *from)

{
  Pipeline *from_local;
  Pipeline *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Pipeline_006f1c88;
  google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::RepeatedPtrField
            (&this->models_,&from->models_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField(&this->names_,&from->names_);
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

Pipeline::Pipeline(const Pipeline& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      models_(from.models_),
      names_(from.names_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.Pipeline)
}